

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::reset(XMLDateTime *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->fValue[lVar1] = 0;
  }
  this->fMilliSecond = 0.0;
  this->fHasTime = false;
  this->fEnd = 0;
  this->fTimeZone[0] = 0;
  this->fTimeZone[1] = 0;
  this->fStart = 0;
  if (this->fBuffer != (XMLCh *)0x0) {
    *this->fBuffer = L'\0';
  }
  return;
}

Assistant:

inline void XMLDateTime::reset()
{
    for ( int i=0; i < TOTAL_SIZE; i++ )
        fValue[i] = 0;

    fMilliSecond   = 0;
    fHasTime      = false;
    fTimeZone[hh] = fTimeZone[mm] = 0;
    fStart = fEnd = 0;

    if (fBuffer)
        *fBuffer = 0;
}